

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImmediateAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImmediateAssertionMemberSyntax,slang::syntax::ImmediateAssertionMemberSyntax_const&>
          (BumpAllocator *this,ImmediateAssertionMemberSyntax *args)

{
  ImmediateAssertionMemberSyntax *this_00;
  
  this_00 = (ImmediateAssertionMemberSyntax *)allocate(this,0x58,8);
  syntax::ImmediateAssertionMemberSyntax::ImmediateAssertionMemberSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }